

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderApiTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::ProgramBinaryUniformResetCase::verifyUniformsReset
          (ProgramBinaryUniformResetCase *this,ShaderProgram *program)

{
  ostringstream *this_00;
  allocator<char> local_199;
  MessageBuilder local_198;
  
  local_198.m_log =
       ((this->super_ProgramBinaryCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
       m_log;
  this_00 = &local_198.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::operator<<((ostream *)this_00,"Verifying uniform reset to 0/false.");
  tcu::MessageBuilder::operator<<(&local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"u_boolVar",&local_199);
  verifyUniformInt(this,program,(string *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"u_intVar",&local_199);
  verifyUniformInt(this,program,(string *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"u_floatVar",&local_199);
  verifyUniformFloat(this,program,(string *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  return;
}

Assistant:

void verifyUniformsReset (glu::ShaderProgram& program)
	{
		m_testCtx.getLog() << TestLog::Message << "Verifying uniform reset to 0/false." << TestLog::EndMessage;

		verifyUniformInt	(program,	"u_boolVar");
		verifyUniformInt	(program,	"u_intVar");
		verifyUniformFloat	(program,	"u_floatVar");
	}